

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int ON::IsOpenNURBSFile(char *utf8pathname)

{
  FILE *fp_00;
  FILE *fp;
  int version;
  char *utf8pathname_local;
  
  fp._4_4_ = 0;
  if (((utf8pathname != (char *)0x0) && (*utf8pathname != '\0')) &&
     (fp_00 = OpenFile(utf8pathname,"rb"), fp_00 != (FILE *)0x0)) {
    fp._4_4_ = IsOpenNURBSFile(fp_00);
    CloseFile(fp_00);
  }
  return fp._4_4_;
}

Assistant:

int ON::IsOpenNURBSFile( const char* utf8pathname )
{
  int version = 0;
  if ( 0 != utf8pathname && 0 != utf8pathname[0] )
  {
    FILE* fp = ON::OpenFile(utf8pathname,"rb");
    if ( 0 != fp )
    {
      version = ON::IsOpenNURBSFile(fp);
      ON::CloseFile(fp);
    }
  }
  return version;
}